

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtaddPairwise<wabt::interp::Simd<int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  Value VVar1;
  Value value;
  
  VVar1 = Pop(this);
  value.field_0.i64_._4_4_ = (VVar1.field_0._4_4_ >> 0x10) + (int)VVar1.field_0._4_2_;
  value.field_0.i32_ = ((int)VVar1.field_0.i32_ >> 0x10) + (int)VVar1.field_0._0_2_;
  value.field_0._12_4_ = (VVar1.field_0._12_4_ >> 0x10) + (int)VVar1.field_0._12_2_;
  value.field_0._8_4_ = (VVar1.field_0._8_4_ >> 0x10) + (int)VVar1.field_0._8_2_;
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtaddPairwise() {
  auto val = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = i * 2;
    result[i] = U(val[laneidx]) + U(val[laneidx + 1]);
  }
  Push(result);
  return RunResult::Ok;
}